

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

Mat3x3d * __thiscall
OpenMD::Thermo::getPressureTensor(Mat3x3d *__return_storage_ptr__,Thermo *this,Snapshot *snap)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  Molecule *pMVar4;
  undefined8 *puVar5;
  uint i_4;
  pointer ppSVar6;
  undefined8 *puVar7;
  StuntDouble *pSVar8;
  double *pdVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  uint j_1;
  double (*__return_storage_ptr___00) [3];
  Vector3d vcom;
  MoleculeIterator i;
  SquareMatrix3<double> result;
  Mat3x3d pressureTensor;
  Mat3x3d virialTensor;
  Mat3x3d p_tens;
  RectMatrix<double,_3U,_3U> result_4;
  RectMatrix<double,_3U,_3U> result_2;
  RectMatrix<double,_3U,_3U> result_3;
  double local_288 [4];
  Mat3x3d *local_268;
  MoleculeIterator local_260;
  undefined8 local_258 [10];
  Mat3x3d local_208;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 local_118 [10];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (snap->hasPressureTensor == false) {
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_128 = 0;
    local_138 = 0;
    uStack_130 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_288[2] = 0.0;
    local_288[0] = 0.0;
    local_288[1] = 0.0;
    local_260._M_node = (_Base_ptr)0x0;
    local_268 = __return_storage_ptr__;
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_260);
    if (pMVar4 != (Molecule *)0x0) {
      do {
        ppSVar6 = (pMVar4->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppSVar6 ==
            (pMVar4->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar8 = (StuntDouble *)0x0;
        }
        else {
          pSVar8 = *ppSVar6;
        }
        while (pSVar8 != (StuntDouble *)0x0) {
          dVar1 = pSVar8->mass_;
          lVar11 = *(long *)((long)&(snap->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar8->storage_);
          local_288[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)pSVar8->localIndex_ * 0x18);
          pdVar9 = (double *)(lVar11 + (long)pSVar8->localIndex_ * 0x18);
          local_288[0] = *pdVar9;
          local_288[1] = pdVar9[1];
          local_258[6] = 0;
          local_258[7] = 0;
          local_258[4] = 0;
          local_258[5] = 0;
          local_258[2] = 0;
          local_258[3] = 0;
          local_258[0] = 0;
          local_258[1] = 0;
          local_258[8] = 0;
          lVar11 = 0;
          puVar5 = local_258;
          do {
            dVar2 = local_288[lVar11];
            lVar12 = 0;
            do {
              puVar5[lVar12] = local_288[lVar12] * dVar2;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            lVar11 = lVar11 + 1;
            puVar5 = puVar5 + 3;
          } while (lVar11 != 3);
          local_188 = 0;
          uStack_180 = 0;
          local_198 = 0;
          uStack_190 = 0;
          local_1a8 = 0.0;
          uStack_1a0 = 0;
          local_1b8 = 0.0;
          dStack_1b0 = 0.0;
          local_178 = 0;
          lVar11 = 0;
          puVar5 = local_258;
          pdVar9 = &local_1b8;
          do {
            lVar12 = 0;
            do {
              pdVar9[lVar12] = (double)puVar5[lVar12] * dVar1;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            lVar11 = lVar11 + 1;
            pdVar9 = pdVar9 + 3;
            puVar5 = puVar5 + 3;
          } while (lVar11 != 3);
          lVar11 = 0;
          pdVar9 = &local_1b8;
          puVar5 = &local_168;
          do {
            lVar12 = 0;
            do {
              puVar5[lVar12] = pdVar9[lVar12] + (double)puVar5[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            lVar11 = lVar11 + 1;
            puVar5 = puVar5 + 3;
            pdVar9 = pdVar9 + 3;
          } while (lVar11 != 3);
          ppSVar6 = ppSVar6 + 1;
          if (ppSVar6 ==
              (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar8 = (StuntDouble *)0x0;
          }
          else {
            pSVar8 = *ppSVar6;
          }
        }
        pMVar4 = SimInfo::nextMolecule(this->info_,&local_260);
      } while (pMVar4 != (Molecule *)0x0);
    }
    local_288[3] = Snapshot::getVolume(this->info_->sman_->currentSnapshot_);
    __return_storage_ptr___00 = (double (*) [3])&local_1b8;
    Snapshot::getVirialTensor((Mat3x3d *)__return_storage_ptr___00,snap);
    __return_storage_ptr__ = local_268;
    puVar5 = &local_c8;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_88 = 0;
    lVar11 = 0;
    do {
      lVar12 = 0;
      do {
        puVar5[lVar12] =
             (((SquareMatrix<double,_3> *)*__return_storage_ptr___00)->
             super_RectMatrix<double,_3U,_3U>).data_[0][lVar12] * 0.0004184;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar11 = lVar11 + 1;
      puVar5 = puVar5 + 3;
      __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
    } while (lVar11 != 3);
    puVar5 = &local_78;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_38 = 0;
    puVar7 = &local_c8;
    puVar10 = &local_168;
    lVar11 = 0;
    do {
      lVar12 = 0;
      do {
        puVar5[lVar12] = (double)puVar10[lVar12] + (double)puVar7[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar11 = lVar11 + 1;
      puVar5 = puVar5 + 3;
      puVar7 = puVar7 + 3;
      puVar10 = puVar10 + 3;
    } while (lVar11 != 3);
    puVar5 = local_118;
    local_118[6] = 0;
    local_118[7] = 0;
    local_118[4] = 0;
    local_118[5] = 0;
    local_118[2] = 0;
    local_118[3] = 0;
    local_118[0] = 0;
    local_118[1] = 0;
    local_118[8] = 0;
    puVar7 = &local_78;
    lVar11 = 0;
    do {
      lVar12 = 0;
      do {
        puVar5[lVar12] = (double)puVar7[lVar12] / local_288[3];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar11 = lVar11 + 1;
      puVar5 = puVar5 + 3;
      puVar7 = puVar7 + 3;
    } while (lVar11 != 3);
    lVar11 = 0;
    do {
      *(undefined8 *)((long)local_258 + lVar11 + 0x10) =
           *(undefined8 *)((long)local_118 + lVar11 + 0x10);
      uVar3 = *(undefined8 *)((long)local_118 + lVar11 + 8);
      *(undefined8 *)((long)local_258 + lVar11) = *(undefined8 *)((long)local_118 + lVar11);
      *(undefined8 *)((long)local_258 + lVar11 + 8) = uVar3;
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x48);
    lVar11 = 0;
    do {
      *(undefined8 *)
       ((long)local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar11 + 0x10) = *(undefined8 *)((long)local_258 + lVar11 + 0x10);
      uVar3 = *(undefined8 *)((long)local_258 + lVar11 + 8);
      *(undefined8 *)
       ((long)local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar11) = *(undefined8 *)((long)local_258 + lVar11);
      *(undefined8 *)
       ((long)local_208.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar11 + 8) = uVar3;
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x48);
    Snapshot::setPressureTensor(snap,&local_208);
  }
  Snapshot::getPressureTensor(__return_storage_ptr__,snap);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getPressureTensor(Snapshot* snap) {
    // returns pressure tensor in units amu*fs^-2*Ang^-1
    // routine derived via viral theorem description in:
    // Paci, E. and Marchi, M. J.Phys.Chem. 1996, 100, 4314-4322
    if (!snap->hasPressureTensor) {
      Mat3x3d pressureTensor;
      Mat3x3d p_tens(0.0);
      RealType mass;
      Vector3d vcom;

      SimInfo::MoleculeIterator i;
      vector<StuntDouble*>::iterator j;
      Molecule* mol;
      StuntDouble* sd;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          mass = sd->getMass();
          vcom = sd->getVel(snap);
          p_tens += mass * outProduct(vcom, vcom);
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, p_tens.getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      RealType volume      = this->getVolume();
      Mat3x3d virialTensor = snap->getVirialTensor();

      pressureTensor =
          (p_tens + Constants::energyConvert * virialTensor) / volume;

      snap->setPressureTensor(pressureTensor);
    }
    return snap->getPressureTensor();
  }